

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonotope.cpp
# Opt level: O1

Matrix<double,__1,_1,_0,__1,_1> *
std::__uninitialized_copy<false>::
__uninit_copy<Eigen::Matrix<double,_1,1,0,_1,1>const*,Eigen::Matrix<double,_1,1,0,_1,1>*>
          (Matrix<double,__1,_1,_0,__1,_1> *__first,Matrix<double,__1,_1,_0,__1,_1> *__last,
          Matrix<double,__1,_1,_0,__1,_1> *__result)

{
  long lVar1;
  long lVar2;
  
  if (__first != __last) {
    lVar1 = 0;
    do {
      lVar2 = lVar1;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 ((long)&(__result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + lVar2),
                 (Matrix<double,__1,_1,_0,__1,_1> *)
                 ((long)&(__first->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + lVar2));
      lVar1 = lVar2 + 0x10;
    } while ((Matrix<double,__1,_1,_0,__1,_1> *)
             ((long)&__first[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data + lVar2) != __last);
    __result = (Matrix<double,__1,_1,_0,__1,_1> *)
               ((long)&__result[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar2);
  }
  return __result;
}

Assistant:

int __attribute__((weak)) myprintf(const char *fmt, ...)
{
	abort();
}